

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdTree.c
# Opt level: O2

int Dsd_TreeCountNonTerminalNodes_rec(Dsd_Node_t *pNode)

{
  short sVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  if (pNode == (Dsd_Node_t *)0x0) {
    __assert_fail("pNode",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/dsd/dsdTree.c"
                  ,0x167,"int Dsd_TreeCountNonTerminalNodes_rec(Dsd_Node_t *)");
  }
  if (((ulong)pNode & 1) == 0) {
    sVar1 = pNode->nVisits;
    if (-1 < sVar1) {
      pNode->nVisits = sVar1 + 1;
      iVar3 = 0;
      if ((sVar1 == 0) && (sVar1 = pNode->nDecs, iVar3 = 0, 1 < sVar1)) {
        iVar3 = 0;
        for (lVar4 = 0; lVar4 < sVar1; lVar4 = lVar4 + 1) {
          iVar2 = Dsd_TreeCountNonTerminalNodes_rec
                            ((Dsd_Node_t *)((ulong)pNode->pDecs[lVar4] & 0xfffffffffffffffe));
          iVar3 = iVar3 + iVar2;
          sVar1 = pNode->nDecs;
        }
        iVar3 = iVar3 + 1;
      }
      return iVar3;
    }
    __assert_fail("pNode->nVisits >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/dsd/dsdTree.c"
                  ,0x169,"int Dsd_TreeCountNonTerminalNodes_rec(Dsd_Node_t *)");
  }
  __assert_fail("!Dsd_IsComplement( pNode )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/dsd/dsdTree.c"
                ,0x168,"int Dsd_TreeCountNonTerminalNodes_rec(Dsd_Node_t *)");
}

Assistant:

int Dsd_TreeCountNonTerminalNodes_rec( Dsd_Node_t * pNode )
{
    int i;
    int Counter = 0;

    assert( pNode );
    assert( !Dsd_IsComplement( pNode ) );
    assert( pNode->nVisits >= 0 );

    if ( pNode->nVisits++ ) // if this is not the first visit, return zero
        return 0;

    if ( pNode->nDecs <= 1 )
        return 0;

    // upon the first visit, go through the list of successors and call recursively 
    for ( i = 0; i < pNode->nDecs; i++ )
        Counter += Dsd_TreeCountNonTerminalNodes_rec( Dsd_Regular(pNode->pDecs[i]) );

    return Counter + 1;
}